

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.cpp
# Opt level: O2

istream * operator>>(istream *stream,skip *x)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  char c;
  char local_21;
  
  lVar2 = *(long *)stream;
  uVar1 = *(uint *)(stream + *(long *)(lVar2 + -0x18) + 0x18);
  *(uint *)(stream + *(long *)(lVar2 + -0x18) + 0x18) = uVar1 & 0xffffefff;
  for (pcVar3 = *(char **)x;
      (((byte)stream[*(long *)(lVar2 + -0x18) + 0x20] & 5) == 0 && (*pcVar3 != '\0'));
      pcVar3 = pcVar3 + 1) {
    std::operator>>(stream,&local_21);
    lVar2 = *(long *)stream;
  }
  *(uint *)(stream + *(long *)(lVar2 + -0x18) + 0x18) = uVar1;
  return stream;
}

Assistant:

std::istream& operator >> (std::istream& stream, const skip& x)
{
    std::ios_base::fmtflags f = stream.flags();
    stream >> std::noskipws;

    char c;
    const char* text = x.text;
    while (stream && *text++)
        stream >> c;

    stream.flags(f);
    return stream;
}